

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    State *state,uchar *in,size_t insize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *__ptr;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uchar *buffer;
  uchar *local_38;
  
  local_38 = (uchar *)0x0;
  uVar4 = lodepng_decode(&local_38,w,h,&state->super_LodePNGState,in,insize);
  __ptr = local_38;
  if (uVar4 == 0 && local_38 != (uchar *)0x0) {
    uVar1 = *w;
    uVar2 = *h;
    uVar3 = (state->super_LodePNGState).info_raw.bitdepth;
    uVar5 = getNumColorChannels((state->super_LodePNGState).info_raw.colortype);
    uVar6 = (ulong)(uVar5 * uVar3);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,__ptr,
               __ptr + (((uint)((ulong)uVar2 * (ulong)uVar1) & 7) * uVar6 + 7 >> 3) +
                       ((ulong)uVar2 * (ulong)uVar1 >> 3) * uVar6);
  }
  free(__ptr);
  return uVar4;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h,
                State& state,
                const unsigned char* in, size_t insize) {
  unsigned char* buffer = NULL;
  unsigned error = lodepng_decode(&buffer, &w, &h, &state, in, insize);
  if(buffer && !error) {
    size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
    out.insert(out.end(), buffer, &buffer[buffersize]);
  }
  lodepng_free(buffer);
  return error;
}